

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O2

void avro::codec_traits<std::vector<double,_std::allocator<double>_>_>::decode
               (Decoder *d,vector<double,_std::allocator<double>_> *s)

{
  pointer pdVar1;
  value_type_conflict4 in_RAX;
  long lVar2;
  bool bVar3;
  double t;
  value_type_conflict4 local_28;
  
  pdVar1 = (s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar1) {
    (s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  local_28 = in_RAX;
  lVar2 = (**(code **)(*(long *)d + 0x80))(d);
  while (lVar2 != 0) {
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      local_28 = (value_type_conflict4)(**(code **)(*(long *)d + 0x40))(d);
      std::vector<double,_std::allocator<double>_>::push_back(s,&local_28);
    }
    lVar2 = (**(code **)(*(long *)d + 0x88))(d);
  }
  return;
}

Assistant:

static void decode(Decoder& d, std::vector<T>& s) {
        s.clear();
        for (size_t n = d.arrayStart(); n != 0; n = d.arrayNext()) {
            for (size_t i = 0; i < n; ++i) {
                T t;
                avro::decode(d, t);
                s.push_back(t);
            }
        }
    }